

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void PPrintScriptStyle(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  int iVar1;
  uint uVar2;
  Node *pNVar3;
  Bool BVar4;
  int iVar5;
  AttVal *pAVar6;
  ctmbstr ptVar7;
  Lexer *node_00;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  uint indent_00;
  char *extraout_RDX;
  char *pcVar8;
  char *extraout_RDX_00;
  undefined4 in_register_00000034;
  Lexer *node_01;
  bool bVar9;
  Lexer *local_58;
  char *local_50;
  
  iVar1 = *(int *)((doc->config).value + 0x62);
  BVar4 = InsideHead((TidyDocImpl *)node,(Node *)CONCAT44(in_register_00000034,mode));
  if (BVar4 != no) {
    prvTidyPFlushLineSmart(doc,indent);
  }
  PCondFlushLineSmart(doc,indent);
  node_00 = (Lexer *)node;
  PPrintTag(doc,mode,indent,node);
  indent_00 = extraout_EDX;
  if (node->content != (Node *)0x0) {
    prvTidyPFlushLineSmart(doc,indent);
    indent_00 = extraout_EDX_00;
  }
  pprint = &doc->pprint;
  if ((iVar1 == 0) || (node->content == (Node *)0x0)) {
    bVar9 = false;
    local_50 = "";
    local_58 = (Lexer *)0x162bed;
  }
  else {
    pAVar6 = prvTidyAttrGetById(node,TidyAttr_TYPE);
    pcVar8 = extraout_RDX;
    if (pAVar6 == (AttVal *)0x0) {
      local_50 = "";
      local_58 = (Lexer *)0x162bed;
    }
    else {
      if (pAVar6->value != (ctmbstr)0x0) {
        iVar5 = prvTidytmbstrcasecmp(pAVar6->value,"text/javascript");
        pcVar8 = "//";
        node_00 = (Lexer *)0x162bed;
        local_50 = "";
        local_58 = (Lexer *)pcVar8;
        if (iVar5 == 0) goto LAB_0014e4fa;
        pcVar8 = "";
      }
      if (pAVar6->value != (ctmbstr)0x0) {
        iVar5 = prvTidytmbstrcasecmp(pAVar6->value,"text/css");
        pcVar8 = "*/";
        node_00 = (Lexer *)0x162bed;
        if (iVar5 != 0) {
          pcVar8 = "";
        }
        local_58 = (Lexer *)"/*";
        local_50 = pcVar8;
        if (iVar5 == 0) goto LAB_0014e4fa;
      }
      local_50 = "";
      local_58 = (Lexer *)0x162bed;
      if (pAVar6->value != (ctmbstr)0x0) {
        iVar5 = prvTidytmbstrcasecmp(pAVar6->value,"text/vbscript");
        node_00 = (Lexer *)0x15f6a9;
        local_50 = "";
        pcVar8 = extraout_RDX_00;
        local_58 = node_00;
        if (iVar5 != 0) {
          node_00 = (Lexer *)0x162bed;
          local_58 = node_00;
        }
      }
    }
LAB_0014e4fa:
    indent_00 = (uint)pcVar8;
    pNVar3 = node->content;
    bVar9 = false;
    if (pNVar3->type == TextNode) {
      node_00 = doc->lexer;
      ptVar7 = prvTidytmbsubstrn(node_00->lexbuf + pNVar3->start,(pNVar3->end - pNVar3->start) + 1,
                                 "<![CDATA[");
      bVar9 = ptVar7 != (ctmbstr)0x0;
      indent_00 = extraout_EDX_01;
    }
    if (!bVar9) {
      uVar2 = *(uint *)((doc->config).value + 0x5d);
      prvTidySetOptionInt(doc,TidyWrapLen,0xffffffff);
      AddString(pprint,(ctmbstr)local_58);
      AddString(pprint,"<![CDATA[");
      AddString(pprint,local_50);
      PCondFlushLineSmart(doc,indent);
      prvTidySetOptionInt(doc,TidyWrapLen,(ulong)uVar2);
      indent_00 = extraout_EDX_02;
    }
  }
  node_01 = (Lexer *)node->content;
  if (node_01 != (Lexer *)0x0) {
    iVar5 = -1;
    do {
      node_00 = node_01;
      prvTidyPPrintTree(doc,mode | 0x19,indent,(Node *)node_01);
      indent_00 = extraout_EDX_03;
      if (node_01 == (Lexer *)node->last) {
        iVar5 = TextEndsWithNewline(doc->lexer,(Node *)node_01,0x10);
        indent_00 = extraout_EDX_04;
      }
      node_01 = *(Lexer **)&node_01->insertspace;
    } while (node_01 != (Lexer *)0x0);
    if (-1 < iVar5) goto LAB_0014e606;
  }
  if (node->content != (Node *)0x0) {
    PCondFlushLineSmart(doc,indent);
    indent_00 = extraout_EDX_05;
  }
LAB_0014e606:
  if ((iVar1 != 0) && (!bVar9 && node->content != (Node *)0x0)) {
    uVar2 = *(uint *)((doc->config).value + 0x5d);
    prvTidySetOptionInt(doc,TidyWrapLen,0xffffffff);
    AddString(pprint,(ctmbstr)local_58);
    AddString(pprint,"]]>");
    AddString(pprint,local_50);
    prvTidySetOptionInt(doc,TidyWrapLen,(ulong)uVar2);
    PCondFlushLineSmart(doc,indent);
    indent_00 = extraout_EDX_06;
  }
  if ((node->content != (Node *)0x0) && ((doc->pprint).indent[0].spaces != indent)) {
    (doc->pprint).indent[0].spaces = indent;
  }
  PPrintEndTag(doc,(uint)node,indent_00,(Node *)node_00);
  if ((((*(int *)((doc->config).value + 0x25) == 0) && (node->next != (Node *)0x0)) &&
      (BVar4 = prvTidynodeHasCM(node,0x10), BVar4 == no)) &&
     (BVar4 = prvTidynodeIsText(node), BVar4 == no)) {
    prvTidyPFlushLineSmart(doc,indent);
    return;
  }
  return;
}

Assistant:

static
void PPrintScriptStyle( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Node*   content;
    ctmbstr commentStart = DEFAULT_COMMENT_START;
    ctmbstr commentEnd = DEFAULT_COMMENT_END;
    Bool    hasCData = no;
    int     contentIndent = -1;
    Bool    xhtmlOut = cfgBool( doc, TidyXhtmlOut );

    if ( InsideHead(doc, node) )
      TY_(PFlushLineSmart)( doc, indent );

    PCondFlushLineSmart( doc, indent );  /* Issue #56 - long oustanding bug - flush any existing closing tag */

    PPrintTag( doc, mode, indent, node );

    /* SCRIPT may have no content such as when loading code via its SRC attribute.
       In this case we don't want to flush the line, preferring to keep the required
       closing SCRIPT tag on the same line. */
    if ( node->content != NULL )
        TY_(PFlushLineSmart)(doc, indent);

    if ( xhtmlOut && node->content != NULL )
    {
        AttVal* type = attrGetTYPE(node);

        if (AttrValueIs(type, "text/javascript"))
        {
            commentStart = JS_COMMENT_START;
            commentEnd = JS_COMMENT_END;
        }
        else if (AttrValueIs(type, "text/css"))
        {
            commentStart = CSS_COMMENT_START;
            commentEnd = CSS_COMMENT_END;
        }
        else if (AttrValueIs(type, "text/vbscript"))
        {
            commentStart = VB_COMMENT_START;
            commentEnd = VB_COMMENT_END;
        }

        hasCData = HasCDATA(doc->lexer, node->content);

        if (!hasCData)
        {
            uint saveWrap = WrapOff( doc );

            AddString( pprint, commentStart );
            AddString( pprint, CDATA_START );
            AddString( pprint, commentEnd );
            PCondFlushLineSmart( doc, indent );

            WrapOn( doc, saveWrap );
        }
    }

    for ( content = node->content;
          content != NULL;
          content = content->next )
    {
        /*
          This is a bit odd, with the current code there can only
          be one child and the only caller of this function defines
          all these modes already...
        */
        TY_(PPrintTree)( doc, (mode | PREFORMATTED | NOWRAP | CDATA), 
                         indent, content );

        if ( content == node->last )
            contentIndent = TextEndsWithNewline( doc->lexer, content, CDATA );
    }

    /* Only flush the line if these was content present so that the closing
       SCRIPT tag will stay on the same line. */
    if ( contentIndent < 0 && node->content != NULL )
    {
        PCondFlushLineSmart( doc, indent );
        contentIndent = 0;
    }

    if ( xhtmlOut && node->content != NULL )
    {
        if ( ! hasCData )
        {
            uint saveWrap = WrapOff( doc );

            AddString( pprint, commentStart );
            AddString( pprint, CDATA_END );
            AddString( pprint, commentEnd );

            WrapOn( doc, saveWrap );
            PCondFlushLineSmart( doc, indent );
        }
    }

    if ( node->content && pprint->indent[ 0 ].spaces != (int)indent )
    {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_INDENT)
        SPRTF("%s Indent from %d to %d\n", __FUNCTION__, pprint->indent[ 0 ].spaces, indent );
#endif  
        pprint->indent[ 0 ].spaces = indent;
    }
    PPrintEndTag( doc, mode, indent, node );
    if ( cfgAutoBool(doc, TidyIndentContent) == TidyNoState
         && node->next != NULL &&
         !( TY_(nodeHasCM)(node, CM_INLINE) || TY_(nodeIsText)(node) ) )
        TY_(PFlushLineSmart)( doc, indent );
}